

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_fd.c
# Opt level: O0

void test_open_fd(void)

{
  int iVar1;
  int iVar2;
  mode_t mVar3;
  archive *paVar4;
  la_ssize_t lVar5;
  __off_t _Var6;
  time_t tVar7;
  long v2;
  char *pcVar8;
  la_int64_t lVar9;
  char *skip_open_fd_err_test;
  int fd;
  archive *a;
  archive_entry *ae;
  char buff [64];
  
  iVar1 = open("test.tar",0x42,0x1ff);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                   ,L'3',(uint)(-1 < iVar1),"fd >= 0",(void *)0x0);
  if (-1 < iVar1) {
    paVar4 = archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                     ,L'8',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                     (void *)0x0);
    iVar2 = archive_write_set_format_ustar(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                        ,L'9',0,"ARCHIVE_OK",(long)iVar2,"archive_write_set_format_ustar(a)",paVar4)
    ;
    iVar2 = archive_write_add_filter_none(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                        ,L':',0,"ARCHIVE_OK",(long)iVar2,"archive_write_add_filter_none(a)",paVar4);
    iVar2 = archive_write_open_fd(paVar4,iVar1);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                        ,L';',0,"ARCHIVE_OK",(long)iVar2,"archive_write_open_fd(a, fd)",paVar4);
    a = (archive *)archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                     ,L'@',(uint)((archive_entry *)a != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_mtime((archive_entry *)a,1,0);
    archive_entry_copy_pathname((archive_entry *)a,"file");
    archive_entry_set_mode((archive_entry *)a,0x81ed);
    archive_entry_set_size((archive_entry *)a,8);
    iVar2 = archive_write_header(paVar4,(archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                        ,L'E',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, ae)",paVar4);
    archive_entry_free((archive_entry *)a);
    lVar5 = archive_write_data(paVar4,"12345678",9);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                        ,L'G',8,"8",lVar5,"archive_write_data(a, \"12345678\", 9)",paVar4);
    a = (archive *)archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                     ,L'L',(uint)((archive_entry *)a != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_copy_pathname((archive_entry *)a,"file2");
    archive_entry_set_mode((archive_entry *)a,0x81ed);
    archive_entry_set_size((archive_entry *)a,0xc8000);
    iVar2 = archive_write_header(paVar4,(archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                        ,L'P',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, ae)",paVar4);
    archive_entry_free((archive_entry *)a);
    iVar2 = archive_write_close(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                        ,L'T',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",paVar4);
    iVar2 = archive_write_free(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                        ,L'U',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
    _Var6 = lseek(iVar1,0,0);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                     ,L'Z',(uint)(_Var6 == 0),"lseek(fd, 0, SEEK_SET) == 0",(void *)0x0);
    paVar4 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                     ,L'[',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    iVar2 = archive_read_support_format_all(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                        ,L'\\',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_format_all(a)",
                        paVar4);
    iVar2 = archive_read_support_filter_all(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                        ,L']',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_filter_all(a)",paVar4
                       );
    iVar2 = archive_read_open_fd(paVar4,iVar1,0x200);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                        ,L'^',0,"ARCHIVE_OK",(long)iVar2,"archive_read_open_fd(a, fd, 512)",paVar4);
    iVar2 = archive_read_next_header(paVar4,(archive_entry **)&a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                        ,L'`',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",paVar4);
    tVar7 = archive_entry_mtime((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                        ,L'a',1,"1",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
    v2 = archive_entry_mtime_nsec((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                        ,L'b',0,"0",v2,"archive_entry_mtime_nsec(ae)",(void *)0x0);
    tVar7 = archive_entry_atime((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                        ,L'c',0,"0",tVar7,"archive_entry_atime(ae)",(void *)0x0);
    tVar7 = archive_entry_ctime((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                        ,L'd',0,"0",tVar7,"archive_entry_ctime(ae)",(void *)0x0);
    pcVar8 = archive_entry_pathname((archive_entry *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
               ,L'e',"file","\"file\"",pcVar8,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    mVar3 = archive_entry_mode((archive_entry *)a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                     ,L'f',(uint)(mVar3 == 0x81ed),"(S_IFREG | 0755) == archive_entry_mode(ae)",
                     (void *)0x0);
    lVar9 = archive_entry_size((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                        ,L'g',8,"8",lVar9,"archive_entry_size(ae)",(void *)0x0);
    lVar5 = archive_read_data(paVar4,&ae,10);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                        ,L'h',8,"8",lVar5,"archive_read_data(a, buff, 10)",paVar4);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                        ,L'i',&ae,"buff","12345678","\"12345678\"",8,"8",(void *)0x0);
    iVar2 = archive_read_next_header(paVar4,(archive_entry **)&a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                        ,L'k',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",paVar4);
    pcVar8 = archive_entry_pathname((archive_entry *)a);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
               ,L'l',"file2","\"file2\"",pcVar8,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    mVar3 = archive_entry_mode((archive_entry *)a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                     ,L'm',(uint)(mVar3 == 0x81ed),"(S_IFREG | 0755) == archive_entry_mode(ae)",
                     (void *)0x0);
    lVar9 = archive_entry_size((archive_entry *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                        ,L'n',0xc8000,"819200",lVar9,"archive_entry_size(ae)",(void *)0x0);
    iVar2 = archive_read_data_skip(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                        ,L'o',0,"ARCHIVE_OK",(long)iVar2,"archive_read_data_skip(a)",paVar4);
    iVar2 = archive_read_next_header(paVar4,(archive_entry **)&a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                        ,L'r',1,"ARCHIVE_EOF",(long)iVar2,"archive_read_next_header(a, &ae)",paVar4)
    ;
    iVar2 = archive_read_close(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                        ,L's',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",paVar4);
    iVar2 = archive_read_free(paVar4);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                        ,L't',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
    close(iVar1);
    pcVar8 = getenv("SKIP_OPEN_FD_ERR_TEST");
    if (pcVar8 == (char *)0x0) {
      paVar4 = archive_read_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                       ,L'|',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                       (void *)0x0);
      iVar1 = archive_read_support_format_all(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                          ,L'}',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",
                          paVar4);
      iVar1 = archive_read_support_filter_all(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                          ,L'~',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",
                          paVar4);
      iVar1 = archive_read_open_fd(paVar4,100,0x200);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                          ,L'\x81',-0x1e,"ARCHIVE_FATAL",(long)iVar1,
                          "archive_read_open_fd(a, 100, 512)",paVar4);
      iVar1 = archive_read_close(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                          ,L'\x82',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar4);
      iVar1 = archive_read_free(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_open_fd.c"
                          ,L'\x83',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
    }
  }
  return;
}

Assistant:

DEFINE_TEST(test_open_fd)
{
	char buff[64];
	struct archive_entry *ae;
	struct archive *a;
	int fd;
	const char *skip_open_fd_err_test;

#if defined(__BORLANDC__)
	fd = open("test.tar", O_RDWR | O_CREAT | O_BINARY);
#else
	fd = open("test.tar", O_RDWR | O_CREAT | O_BINARY, 0777);
#endif
	assert(fd >= 0);
	if (fd < 0)
		return;

	/* Write an archive through this fd. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_none(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_fd(a, fd));

	/*
	 * Write a file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 0);
	archive_entry_copy_pathname(ae, "file");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 8);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 8, archive_write_data(a, "12345678", 9));

	/*
	 * Write a second file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "file2");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, 819200);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Now, read the data back.
	 */
	assert(lseek(fd, 0, SEEK_SET) == 0);
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_fd(a, fd, 512));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(1, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(0, archive_entry_atime(ae));
	assertEqualInt(0, archive_entry_ctime(ae));
	assertEqualString("file", archive_entry_pathname(ae));
	assert((S_IFREG | 0755) == archive_entry_mode(ae));
	assertEqualInt(8, archive_entry_size(ae));
	assertEqualIntA(a, 8, archive_read_data(a, buff, 10));
	assertEqualMem(buff, "12345678", 8);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("file2", archive_entry_pathname(ae));
	assert((S_IFREG | 0755) == archive_entry_mode(ae));
	assertEqualInt(819200, archive_entry_size(ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_data_skip(a));

	/* Verify the end of the archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	close(fd);

	skip_open_fd_err_test = getenv("SKIP_OPEN_FD_ERR_TEST");
	if(skip_open_fd_err_test == NULL) {
		/*
		 * Verify some of the error handling.
		 */
		assert((a = archive_read_new()) != NULL);
		assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
		/* FD 100 shouldn't be open. */
		assertEqualIntA(a, ARCHIVE_FATAL,
		archive_read_open_fd(a, 100, 512));
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
		assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	}
}